

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pf_buffermgr.cc
# Opt level: O2

RC __thiscall PF_BufferMgr::ResizeBuffer(PF_BufferMgr *this,int iNewSize)

{
  PF_BufPageDesc *pPVar1;
  int iVar2;
  int iVar3;
  RC RVar4;
  PF_BufPageDesc *pPVar5;
  void *__s;
  int iVar6;
  long lVar7;
  ulong uVar8;
  int iVar9;
  ulong uVar10;
  int newSlot;
  ulong local_38;
  
  ClearBuffer(this);
  local_38 = (long)iNewSize << 5;
  lVar7 = 0;
  uVar8 = 0xffffffffffffffff;
  if (-1 < iNewSize) {
    uVar8 = local_38;
  }
  uVar10 = 0;
  if (0 < iNewSize) {
    uVar10 = (ulong)(uint)iNewSize;
  }
  pPVar5 = (PF_BufPageDesc *)operator_new__(uVar8);
  iVar9 = this->pageSize;
  iVar6 = -1;
  iVar3 = -1;
  if (-1 < iVar9) {
    iVar3 = iVar9;
  }
  for (; uVar10 * 0x20 != lVar7; lVar7 = lVar7 + 0x20) {
    __s = operator_new__((long)iVar3);
    *(void **)((long)&pPVar5->pData + lVar7) = __s;
    memset(__s,0,(long)iVar9);
    *(int *)((long)&pPVar5->prev + lVar7) = iVar6;
    *(int *)((long)&pPVar5->next + lVar7) = iVar6 + 2;
    iVar6 = iVar6 + 1;
  }
  *(undefined4 *)((long)pPVar5 + (local_38 - 0x18)) = 0xffffffff;
  pPVar5->prev = -1;
  iVar9 = this->first;
  pPVar1 = this->bufTable;
  this->numPages = iNewSize;
  this->last = -1;
  this->free = 0;
  this->first = -1;
  this->bufTable = pPVar5;
  iVar6 = iVar9;
  do {
    if (iVar6 == -1) {
      while( true ) {
        if (iVar9 == -1) {
          if (pPVar1 == (PF_BufPageDesc *)0x0) {
            return 0;
          }
          operator_delete__(pPVar1);
          return 0;
        }
        iVar6 = pPVar1[iVar9].next;
        RVar4 = InternalAlloc(this,&newSlot);
        iVar3 = newSlot;
        if (RVar4 != 0) break;
        RVar4 = PF_HashTable::Insert
                          (&this->hashTable,pPVar1[iVar9].fd,pPVar1[iVar9].pageNum,newSlot);
        if (RVar4 != 0) {
          return RVar4;
        }
        lVar7 = (long)iVar3;
        pPVar5 = this->bufTable;
        iVar2 = pPVar1[iVar9].fd;
        pPVar5[lVar7].pageNum = pPVar1[iVar9].pageNum;
        pPVar5[lVar7].fd = iVar2;
        pPVar5[lVar7].bDirty = 0;
        pPVar5[lVar7].pinCount = 1;
        Unlink(this,iVar3);
        this->bufTable[lVar7].next = this->free;
        this->free = iVar3;
        iVar9 = iVar6;
      }
      return RVar4;
    }
    iVar3 = pPVar1[iVar6].next;
    RVar4 = PF_HashTable::Delete(&this->hashTable,pPVar1[iVar6].fd,pPVar1[iVar6].pageNum);
    iVar6 = iVar3;
  } while (RVar4 == 0);
  return RVar4;
}

Assistant:

RC PF_BufferMgr::ResizeBuffer(int iNewSize)
{
   int i;
   RC rc;

   // First try and clear out the old buffer!
   ClearBuffer();

   // Allocate memory for a new buffer table
   PF_BufPageDesc *pNewBufTable = new PF_BufPageDesc[iNewSize];

   // Initialize the new buffer table and allocate memory for buffer
   // pages.  Initially, the free list contains all pages
   for (i = 0; i < iNewSize; i++) {
      if ((pNewBufTable[i].pData = new char[pageSize]) == NULL) {
         cerr << "Not enough memory for buffer\n";
         exit(1);
      }

      memset ((void *)pNewBufTable[i].pData, 0, pageSize);

      pNewBufTable[i].prev = i - 1;
      pNewBufTable[i].next = i + 1;
   }
   pNewBufTable[0].prev = pNewBufTable[iNewSize - 1].next = INVALID_SLOT;

   // Now we must remember the old first and last slots and (of course)
   // the buffer table itself.  Then we use insert methods to insert
   // each of the entries into the new buffertable
   int oldFirst = first;
   PF_BufPageDesc *pOldBufTable = bufTable;

   // Setup the new number of pages,  first, last and free
   numPages = iNewSize;
   first = last = INVALID_SLOT;
   free = 0;

   // Setup the new buffer table
   bufTable = pNewBufTable;

   // We must first remove from the hashtable any possible entries
   int slot, next, newSlot;
   slot = oldFirst;
   while (slot != INVALID_SLOT) {
      next = pOldBufTable[slot].next;

      // Must remove the entry from the hashtable from the
      if ((rc=hashTable.Delete(pOldBufTable[slot].fd, pOldBufTable[slot].pageNum)))
         return (rc);
      slot = next;
   }

   // Now we traverse through the old buffer table and copy any old
   // entries into the new one
   slot = oldFirst;
   while (slot != INVALID_SLOT) {

      next = pOldBufTable[slot].next;
      // Allocate a new slot for the old page
      if ((rc = InternalAlloc(newSlot)))
         return (rc);

      // Insert the page into the hash table,
      // and initialize the page description entry
      if ((rc = hashTable.Insert(pOldBufTable[slot].fd,
            pOldBufTable[slot].pageNum, newSlot)) ||
            (rc = InitPageDesc(pOldBufTable[slot].fd,
            pOldBufTable[slot].pageNum, newSlot)))
         return (rc);

      // Put the slot back on the free list before returning the error
      Unlink(newSlot);
      InsertFree(newSlot);

      slot = next;
   }

   // Finally, delete the old buffer table
   delete [] pOldBufTable;

   return 0;
}